

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateFieldInitializers
          (MessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FieldGenerator *pFVar5;
  OneofDescriptor *this_00;
  ulong uVar6;
  ulong extraout_RDX;
  OneofDescriptor *oneof;
  string local_80;
  int local_5c;
  FieldDescriptor *pFStack_58;
  int i_2;
  FieldDescriptor *field;
  int i_1;
  string local_40;
  uint local_20;
  int local_1c;
  int i;
  int totalInts;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  _i = printer;
  printer_local = (Printer *)this;
  iVar3 = FieldGeneratorMap::total_bits(&this->field_generators_);
  local_1c = (iVar3 + 0x1f) / 0x20;
  uVar6 = (long)(iVar3 + 0x1f) % 0x20 & 0xffffffff;
  for (local_20 = 0; pPVar1 = _i, (int)local_20 < local_1c; local_20 = local_20 + 1) {
    GetBitFieldName_abi_cxx11_(&local_40,(javanano *)(ulong)local_20,(int)uVar6);
    io::Printer::Print(pPVar1,"$bit_field_name$ = 0;\n","bit_field_name",&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    uVar6 = extraout_RDX;
  }
  for (field._0_4_ = 0; iVar3 = (int)field, iVar4 = Descriptor::field_count(this->descriptor_),
      iVar3 < iVar4; field._0_4_ = (int)field + 1) {
    pFStack_58 = Descriptor::field(this->descriptor_,(int)field);
    pFVar5 = FieldGeneratorMap::get(&this->field_generators_,pFStack_58);
    (*pFVar5->_vptr_FieldGenerator[5])(pFVar5,_i);
  }
  for (local_5c = 0; iVar3 = local_5c, iVar4 = Descriptor::oneof_decl_count(this->descriptor_),
      pPVar1 = _i, iVar3 < iVar4; local_5c = local_5c + 1) {
    this_00 = Descriptor::oneof_decl(this->descriptor_,local_5c);
    UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_80,(javanano *)this_00,oneof);
    io::Printer::Print(pPVar1,"clear$oneof_capitalized_name$();\n","oneof_capitalized_name",
                       &local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  bVar2 = Params::store_unknown_fields(this->params_);
  if (bVar2) {
    io::Printer::Print(_i,"unknownFieldData = null;\n");
  }
  io::Printer::Print(_i,"cachedSize = -1;\n");
  return;
}

Assistant:

void MessageGenerator::GenerateFieldInitializers(io::Printer* printer) {
  // Clear bit fields.
  int totalInts = (field_generators_.total_bits() + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("$bit_field_name$ = 0;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  // Call clear for all of the fields.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    field_generators_.get(field).GenerateClearCode(printer);
  }

  // Clear oneofs.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
      "clear$oneof_capitalized_name$();\n",
      "oneof_capitalized_name", UnderscoresToCapitalizedCamelCase(
          descriptor_->oneof_decl(i)));
  }

  // Clear unknown fields.
  if (params_.store_unknown_fields()) {
    printer->Print("unknownFieldData = null;\n");
  }
  printer->Print("cachedSize = -1;\n");
}